

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamHttp::Close(BamHttp *this)

{
  DisconnectSocket(this);
  this->m_isUrlParsed = false;
  this->m_rangeEndPosition = -1;
  *(undefined4 *)&this->m_filePosition = 0xffffffff;
  *(undefined4 *)((long)&this->m_filePosition + 4) = 0xffffffff;
  *(undefined4 *)&this->m_fileEndPosition = 0xffffffff;
  *(undefined4 *)((long)&this->m_fileEndPosition + 4) = 0xffffffff;
  (this->super_IBamIODevice).m_mode = NotOpen;
  return;
}

Assistant:

void BamHttp::Close(void) {

    // disconnect socket & clear related resources
    DisconnectSocket();

    // reset state
    m_isUrlParsed = false;
    m_filePosition     = -1;
    m_fileEndPosition  = -1;
    m_rangeEndPosition = -1;
    m_mode = IBamIODevice::NotOpen;
}